

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNBase::DataLoad(OPNBase *this,OPNBaseData *data)

{
  OPNBaseData *data_local;
  OPNBase *this_local;
  
  Timer::DataLoad(&this->super_Timer,&data->timer);
  this->fmvolume = data->fmvolume;
  this->clock = data->clock;
  this->rate = data->rate;
  this->psgrate = data->psgrate;
  this->status = data->status;
  this->prescale = data->prescale;
  Chip::DataLoad(&this->chip,&data->chip);
  PSG::DataLoad(&this->psg,&data->psg);
  return;
}

Assistant:

void OPNBase::DataLoad(struct OPNBaseData* data) {
	Timer::DataLoad(&data->timer);
	fmvolume = data->fmvolume;
	clock = data->clock;
	rate = data->rate;
	psgrate = data->psgrate;
	status = data->status;
	prescale = data->prescale;
	chip.DataLoad(&data->chip);
	psg.DataLoad(&data->psg);
}